

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_134::checkEnumList<capnp::DynamicValue::Builder>
          (anon_unknown_134 *this,Builder *reader,initializer_list<const_char_*> expected)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  const_iterator ppcVar4;
  BuilderFor<capnp::DynamicEnum> BVar5;
  ArrayPtr<const_char> AVar6;
  DynamicEnum e;
  DynamicEnum e_00;
  Builder local_1d0;
  Schema local_190;
  uint local_188;
  ArrayPtr<const_char> local_180;
  bool local_169;
  Schema SStack_168;
  bool _kj_shouldLog;
  uint16_t local_160;
  Builder local_158;
  Schema local_118;
  uint local_110;
  ArrayPtr<const_char> local_108;
  char **local_f8;
  undefined1 local_f0 [8];
  DebugComparison<const_char_*const_&,_capnp::Text::Reader> _kjCondition_1;
  uint i;
  uint local_ac;
  size_type local_a8;
  Fault local_a0;
  Fault f;
  size_type local_90;
  DebugExpression<unsigned_long> local_88;
  undefined1 local_80 [8];
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  BuilderFor<capnp::DynamicList> list;
  Builder *reader_local;
  initializer_list<const_char_*> expected_local;
  
  expected_local._M_array = expected._M_array;
  reader_local = reader;
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)&_kjCondition.result,(Builder *)this);
  local_90 = std::initializer_list<const_char_*>::size
                       ((initializer_list<const_char_*> *)&reader_local);
  local_88 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_90);
  f.exception._4_4_ = DynamicList::Builder::size((Builder *)&_kjCondition.result);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_int> *)local_80,&local_88,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
  if (bVar1) {
    _kjCondition_1.result = false;
    _kjCondition_1._41_3_ = 0;
    while( true ) {
      uVar2 = (ulong)(uint)_kjCondition_1._40_4_;
      sVar3 = std::initializer_list<const_char_*>::size
                        ((initializer_list<const_char_*> *)&reader_local);
      if (sVar3 <= uVar2) break;
      ppcVar4 = std::initializer_list<const_char_*>::begin
                          ((initializer_list<const_char_*> *)&reader_local);
      local_f8 = (char **)kj::_::DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                     ppcVar4 + (uint)_kjCondition_1._40_4_);
      DynamicList::Builder::operator[]
                (&local_158,(Builder *)&_kjCondition.result,_kjCondition_1._40_4_);
      BVar5 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_158);
      e._8_8_ = BVar5._8_8_;
      SStack_168.raw = (RawBrandedSchema *)BVar5.schema.super_Schema.raw;
      local_160 = BVar5.value;
      local_110 = CONCAT22(local_110._2_2_,local_160);
      e.schema.super_Schema.raw._4_4_ = 0;
      e.schema.super_Schema.raw._0_4_ = local_110;
      local_118.raw = SStack_168.raw;
      AVar6 = (ArrayPtr<const_char>)name((anon_unknown_134 *)SStack_168.raw,e);
      local_108 = AVar6;
      kj::_::DebugExpression<char_const*const&>::operator==
                ((DebugComparison<const_char_*const_&,_capnp::Text::Reader> *)local_f0,
                 (DebugExpression<char_const*const&> *)&local_f8,(Reader *)&local_108);
      DynamicValue::Builder::~Builder(&local_158);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f0);
      if (!bVar1) {
        local_169 = kj::_::Debug::shouldLog(ERROR);
        while (local_169 != false) {
          ppcVar4 = std::initializer_list<const_char_*>::begin
                              ((initializer_list<const_char_*> *)&reader_local);
          uVar2 = (ulong)(uint)_kjCondition_1._40_4_;
          DynamicList::Builder::operator[]
                    (&local_1d0,(Builder *)&_kjCondition.result,_kjCondition_1._40_4_);
          BVar5 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_1d0);
          e_00._8_8_ = BVar5._8_8_;
          local_190.raw = (RawBrandedSchema *)BVar5.schema.super_Schema.raw;
          local_188 = CONCAT22(local_188._2_2_,BVar5.value);
          e_00.schema.super_Schema.raw._4_4_ = 0;
          e_00.schema.super_Schema.raw._0_4_ = local_188;
          AVar6 = (ArrayPtr<const_char>)name((anon_unknown_134 *)local_190.raw,e_00);
          local_180 = AVar6;
          kj::_::Debug::
          log<char_const(&)[85],kj::_::DebugComparison<char_const*const&,capnp::Text::Reader>&,char_const*const&,capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x152,ERROR,
                     "\"failed: expected \" \"(expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))\", _kjCondition, expected.begin()[i], name(list[i].template as<DynamicEnum>())"
                     ,(char (*) [85])
                      "failed: expected (expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))"
                     ,(DebugComparison<const_char_*const_&,_capnp::Text::Reader> *)local_f0,
                     ppcVar4 + uVar2,(Reader *)&local_180);
          DynamicValue::Builder::~Builder(&local_1d0);
          local_169 = false;
        }
      }
      _kjCondition_1._40_4_ = _kjCondition_1._40_4_ + 1;
    }
    return;
  }
  local_a8 = std::initializer_list<const_char_*>::size
                       ((initializer_list<const_char_*> *)&reader_local);
  local_ac = DynamicList::Builder::size((Builder *)&_kjCondition.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x150,FAILED,"(expected.size()) == (list.size())",
             "_kjCondition,expected.size(), list.size()",
             (DebugComparison<unsigned_long,_unsigned_int> *)local_80,&local_a8,&local_ac);
  kj::_::Debug::Fault::fatal(&local_a0);
}

Assistant:

void checkEnumList(T reader, std::initializer_list<const char*> expected) {
  auto list = reader.as<DynamicList>();
  ASSERT_EQ(expected.size(), list.size());
  for (uint i = 0; i < expected.size(); i++) {
    EXPECT_EQ(expected.begin()[i], name(list[i].as<DynamicEnum>()));
  }
}